

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

uint64_t google::protobuf::internal::EndianHelper<8>::Load(void *p)

{
  uint64_t tmp;
  void *p_local;
  
  return *p;
}

Assistant:

static uint64_t Load(const void* p) {
    uint64_t tmp;
    std::memcpy(&tmp, p, 8);
#ifndef PROTOBUF_LITTLE_ENDIAN
    tmp = bswap_64(tmp);
#endif
    return tmp;
  }